

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<(anonymous_namespace)::TreeNode>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::TreeNode> *this,GrowthPosition where,qsizetype n
          ,QArrayDataPointer<(anonymous_namespace)::TreeNode> *old)

{
  long lVar1;
  bool bVar2;
  QPodArrayOps<(anonymous_namespace)::TreeNode> *this_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<(anonymous_namespace)::TreeNode> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<(anonymous_namespace)::TreeNode> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  TreeNode *in_stack_ffffffffffffff80;
  TreeNode *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)
                           in_stack_ffffffffffffff80), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)&DAT_aaaaaaaaaaaaaaaa,
                 -0x5555555555555556,0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)
                          in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<(anonymous_namespace)::TreeNode> *)
                  operator->((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)0x5d4778);
        begin((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)0x5d4787);
        QtPrivate::QPodArrayOps<(anonymous_namespace)::TreeNode>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (TreeNode *)
             operator->((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)
                        &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)0x5d47bd);
        begin((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)0x5d47cc);
        QtPrivate::QPodArrayOps<(anonymous_namespace)::TreeNode>::moveAppend
                  ((QPodArrayOps<(anonymous_namespace)::TreeNode> *)in_stack_ffffffffffffff80,
                   (TreeNode *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (TreeNode *)0x5d47e7);
      }
    }
    swap((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)in_stack_ffffffffffffff80,
         (QArrayDataPointer<(anonymous_namespace)::TreeNode> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)in_stack_ffffffffffffff80,
           (QArrayDataPointer<(anonymous_namespace)::TreeNode> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)
                       in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity
              ((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)in_stack_ffffffffffffff80);
    freeSpaceAtEnd((QArrayDataPointer<(anonymous_namespace)::TreeNode> *)in_stack_ffffffffffffff88);
    QtPrivate::QPodArrayOps<(anonymous_namespace)::TreeNode>::reallocate
              ((QPodArrayOps<(anonymous_namespace)::TreeNode> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }